

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.h
# Opt level: O1

string * __thiscall
cmGlobalNinjaMultiGenerator::BuildAlias
          (string *__return_storage_ptr__,cmGlobalNinjaMultiGenerator *this,string *alias,
          string *config)

{
  pointer pcVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined8 local_28;
  char *local_20;
  size_type local_18;
  pointer local_10;
  
  local_18 = config->_M_string_length;
  if (local_18 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (alias->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + alias->_M_string_length);
  }
  else {
    local_38._M_str = (alias->_M_dataplus)._M_p;
    local_38._M_len = alias->_M_string_length;
    local_28 = 1;
    local_20 = ":";
    local_10 = (config->_M_dataplus)._M_p;
    views._M_len = 3;
    views._M_array = &local_38;
    cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BuildAlias(const std::string& alias,
                         const std::string& config) const override
  {
    if (config.empty()) {
      return alias;
    }
    return cmStrCat(alias, ":", config);
  }